

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O0

void __thiscall
soul::heart::Printer::PrinterStream::printDescription(PrinterStream *this,Annotation *annotation)

{
  CodePrinter *this_00;
  string local_38;
  Annotation *local_18;
  Annotation *annotation_local;
  PrinterStream *this_local;
  
  this_00 = this->out;
  local_18 = annotation;
  annotation_local = (Annotation *)this;
  Annotation::toHEART_abi_cxx11_(&local_38,annotation);
  choc::text::CodePrinter::operator<<(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void printDescription (const Annotation& annotation)
        {
            out << annotation.toHEART();
        }